

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

void DirectoryCommit(path *dirname)

{
  long lVar1;
  int __fd;
  FILE *__stream;
  char *in_RDI;
  long in_FS_OFFSET;
  FILE *file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fsbridge::fopen(in_RDI,"r");
  if (__stream != (FILE *)0x0) {
    __fd = fileno(__stream);
    fsync(__fd);
    fclose(__stream);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DirectoryCommit(const fs::path& dirname)
{
#ifndef WIN32
    FILE* file = fsbridge::fopen(dirname, "r");
    if (file) {
        fsync(fileno(file));
        fclose(file);
    }
#endif
}